

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

char * google::protobuf::ParseLenDelim
                 (int field_number,FieldDescriptor *field,Message *msg,Reflection *reflection,
                 char *ptr,ParseContext *ctx)

{
  bool bVar1;
  WireType WVar2;
  Type TVar3;
  Syntax SVar4;
  FieldOptions_CType FVar5;
  char *pcVar6;
  FileDescriptor *this;
  LogMessage *pLVar7;
  Reflection *in_RCX;
  string *in_RSI;
  undefined8 in_R8;
  ParseContext *in_R9;
  Message *object_4;
  string *object_3;
  string *object_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object;
  int index;
  bool utf8_verification;
  bool enforce_utf8;
  anon_class_32_4_7f07c394 parse_string;
  char *field_name;
  anon_enum_32 utf8_level;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  ParseContext *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  LogLevel_conflict in_stack_fffffffffffffdec;
  FieldDescriptor *in_stack_fffffffffffffdf0;
  Message *in_stack_fffffffffffffdf8;
  Reflection *in_stack_fffffffffffffe00;
  FieldDescriptor *in_stack_fffffffffffffe08;
  Message *in_stack_fffffffffffffe10;
  FieldDescriptor *in_stack_fffffffffffffe18;
  Message *in_stack_fffffffffffffe20;
  Reflection *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  string *s;
  anon_class_32_4_7f07c394 *in_stack_fffffffffffffe48;
  anon_class_32_4_7f07c394 *this_00;
  string *in_stack_fffffffffffffe50;
  Reflection *in_stack_fffffffffffffe58;
  Message *in_stack_fffffffffffffe60;
  Reflection *in_stack_fffffffffffffe68;
  allocator *paVar8;
  int value;
  undefined4 in_stack_fffffffffffffe70;
  ParseContext *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Reflection *in_stack_fffffffffffffe88;
  Message *in_stack_fffffffffffffe90;
  FieldDescriptor *in_stack_fffffffffffffe98;
  undefined1 local_119 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  byte local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  ParseContext *local_b0;
  undefined4 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined4 local_8c [21];
  ParseContext *local_38;
  undefined8 local_30;
  Reflection *local_28;
  string *local_18;
  char *local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  FieldDescriptor::type(in_stack_fffffffffffffdf0);
  WVar2 = internal::WireFormat::WireTypeForFieldType(0);
  if (WVar2 != WIRETYPE_LENGTH_DELIMITED) {
    pcVar6 = ParsePackedField(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                              in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                              in_stack_fffffffffffffe78);
    return pcVar6;
  }
  local_8c[0] = 0;
  local_98 = 0;
  local_b8 = local_30;
  local_b0 = local_38;
  local_a8 = local_8c;
  local_a0 = &local_98;
  TVar3 = FieldDescriptor::type(in_stack_fffffffffffffdf0);
  if (TVar3 == TYPE_STRING) {
    local_b9 = 1;
    local_ba = 1;
    this = FieldDescriptor::file((FieldDescriptor *)local_18);
    SVar4 = FileDescriptor::syntax(this);
    if (SVar4 == SYNTAX_PROTO3) {
      local_8c[0] = 2;
    }
    else if ((local_ba & 1) != 0) {
      local_8c[0] = 1;
    }
    FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)local_18);
    local_98 = std::__cxx11::string::c_str();
  }
  else {
    if (TVar3 == TYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x42753d);
      if (bVar1) {
        internal::ParseContext::data(local_38);
        Reflection::AddMessage
                  (local_28,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   (MessageFactory *)in_stack_fffffffffffffe00);
      }
      else {
        internal::ParseContext::data(local_38);
        Reflection::MutableMessage
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (MessageFactory *)local_18);
      }
      pcVar6 = internal::ParseContext::ParseMessage
                         (in_stack_fffffffffffffde0,
                          (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          (char *)0x42760a);
      return pcVar6;
    }
    if (TVar3 != TYPE_BYTES) {
      pLVar7 = (LogMessage *)&stack0xfffffffffffffe90;
      internal::LogMessage::LogMessage
                (pLVar7,in_stack_fffffffffffffdec,(char *)in_stack_fffffffffffffde0,
                 in_stack_fffffffffffffddc);
      value = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffffde0,
                 (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      FieldDescriptor::type((FieldDescriptor *)pLVar7);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)CONCAT44(TVar3,in_stack_fffffffffffffe70),value);
      internal::LogFinisher::operator=
                ((LogFinisher *)pLVar7,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      internal::LogMessage::~LogMessage((LogMessage *)0x42769b);
      return (char *)0x0;
    }
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4271a5);
  if (bVar1) {
    local_c0 = Reflection::FieldSize
                         (in_stack_fffffffffffffe58,(Message *)in_stack_fffffffffffffe50,
                          (FieldDescriptor *)in_stack_fffffffffffffe48);
    paVar8 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,anon_var_dwarf_290687 + 0x11,paVar8);
    Reflection::AddString
              (local_28,(Message *)in_stack_fffffffffffffe48,
               (FieldDescriptor *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    FieldDescriptor::options((FieldDescriptor *)local_18);
    FVar5 = FieldOptions::ctype((FieldOptions *)0x427285);
    if ((FVar5 == FieldOptions_CType_STRING) ||
       (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)local_18), bVar1)) {
      Reflection::MutableRepeatedPtrField<std::__cxx11::string>
                ((Reflection *)in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (FieldDescriptor *)0x4272bd);
      local_f0 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Mutable((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      local_8 = ParseLenDelim::anon_class_32_4_7f07c394::operator()
                          (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
    else {
      Reflection::MutableRepeatedPtrField<std::__cxx11::string>
                ((Reflection *)in_stack_fffffffffffffde0,
                 (Message *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (FieldDescriptor *)0x42735c);
      local_f8 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Mutable((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      local_8 = ParseLenDelim::anon_class_32_4_7f07c394::operator()
                          (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    }
  }
  else {
    this_00 = (anon_class_32_4_7f07c394 *)local_119;
    s = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_119 + 1),anon_var_dwarf_290687 + 0x11,(allocator *)this_00);
    Reflection::SetString
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               (FieldDescriptor *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    FieldDescriptor::options((FieldDescriptor *)local_18);
    FVar5 = FieldOptions::ctype((FieldOptions *)0x427436);
    if ((FVar5 == FieldOptions_CType_STRING) ||
       (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)local_18), bVar1)) {
      Reflection::GetStringReference
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_8 = ParseLenDelim::anon_class_32_4_7f07c394::operator()(this_00,s);
    }
    else {
      Reflection::GetStringReference
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 (string *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_8 = ParseLenDelim::anon_class_32_4_7f07c394::operator()(this_00,s);
    }
  }
  return local_8;
}

Assistant:

const char* ParseLenDelim(int field_number, const FieldDescriptor* field,
                          Message* msg, const Reflection* reflection,
                          const char* ptr, internal::ParseContext* ctx) {
  if (WireFormat::WireTypeForFieldType(field->type()) !=
      WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    GOOGLE_DCHECK(field->is_packable());
    return ParsePackedField(field, msg, reflection, ptr, ctx);
  }
  enum { kNone = 0, kVerify, kStrict } utf8_level = kNone;
  const char* field_name = nullptr;
  auto parse_string = [ptr, ctx, &utf8_level,
                       &field_name](std::string* s) -> const char* {
    switch (utf8_level) {
      case kNone:
        return internal::InlineGreedyStringParser(s, ptr, ctx);
      case kVerify:
        return internal::InlineGreedyStringParserUTF8Verify(s, ptr, ctx,
                                                            field_name);
      case kStrict:
        return internal::InlineGreedyStringParserUTF8(s, ptr, ctx, field_name);
    }
    GOOGLE_LOG(FATAL) << "Should not reach here";
    return nullptr;  // Make compiler happy
  };
  switch (field->type()) {
    case FieldDescriptor::TYPE_STRING: {
      bool enforce_utf8 = true;
      bool utf8_verification = true;
      if (enforce_utf8 &&
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        utf8_level = kStrict;
      } else if (utf8_verification) {
        utf8_level = kVerify;
      }
      field_name = field->full_name().c_str();
      PROTOBUF_FALLTHROUGH_INTENDED;
    }
    case FieldDescriptor::TYPE_BYTES: {
      if (field->is_repeated()) {
        int index = reflection->FieldSize(*msg, field);
        // Add new empty value.
        reflection->AddString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        } else {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        }
      } else {
        // Clear value and make sure it's set.
        reflection->SetString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        } else {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        }
      }
      GOOGLE_LOG(FATAL) << "No other type than string supported";
    }
    case FieldDescriptor::TYPE_MESSAGE: {
      Message* object;
      if (field->is_repeated()) {
        object = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        object = reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(object, ptr);
    }
    default:
      GOOGLE_LOG(FATAL) << "Wrong type for length delim " << field->type();
  }
  return nullptr;  // Make compiler happy.
}